

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O0

void aes_sdctr_sw(ssh_cipher *ciph,void *vblk,int blklen)

{
  ssh_cipheralg *psVar1;
  BignumDblInt ADC_temp;
  uint local_5c;
  ulong uStack_58;
  uint i_1;
  BignumCarry carry;
  ssh_cipheralg *psStack_48;
  uint i;
  uint8_t *block;
  uint8_t *finish;
  uint8_t *blk;
  uint8_t *keystream_end;
  aes_sw_context *ctx;
  int blklen_local;
  void *vblk_local;
  ssh_cipher *ciph_local;
  
  for (finish = (uint8_t *)vblk; finish < (uint8_t *)((long)vblk + (long)blklen);
      finish = finish + 0x10) {
    if (ciph[-1].vt == (ssh_cipheralg *)(ciph + -1)) {
      for (psStack_48 = (ssh_cipheralg *)(ciph + -9); psStack_48 < (ssh_cipheralg *)(ciph + -1);
          psStack_48 = (ssh_cipheralg *)&psStack_48->setiv) {
        for (carry._4_4_ = 0; carry._4_4_ < 2; carry._4_4_ = carry._4_4_ + 1) {
          PUT_64BIT_MSB_FIRST((void *)((long)psStack_48 + (8 - (ulong)(carry._4_4_ << 3))),
                              (uint64_t)ciph[(ulong)carry._4_4_ - 0xb].vt);
        }
        uStack_58 = 1;
        for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
          psVar1 = (ssh_cipheralg *)((long)&(ciph[(ulong)local_5c - 0xb].vt)->new + uStack_58);
          uStack_58 = (ulong)CARRY8((ulong)ciph[(ulong)local_5c - 0xb].vt,uStack_58);
          ciph[(ulong)local_5c - 0xb].vt = psVar1;
        }
      }
      aes_sliced_e_parallel
                ((uint8_t *)(ciph + -9),(uint8_t *)(ciph + -9),(aes_sliced_key *)(ciph + -0xa2));
      ciph[-1].vt = (ssh_cipheralg *)(ciph + -9);
    }
    memxor16(finish,finish,ciph[-1].vt);
    ciph[-1].vt = (ssh_cipheralg *)&(ciph[-1].vt)->setiv;
  }
  return;
}

Assistant:

static inline void aes_sdctr_sw(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);

    /*
     * SDCTR encrypt/decrypt loops round one block at a time XORing
     * the keystream into the user's data, and periodically has to run
     * a parallel encryption operation to get more keystream.
     */

    uint8_t *keystream_end =
        ctx->iv.sdctr.keystream + sizeof(ctx->iv.sdctr.keystream);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {

        if (ctx->iv.sdctr.keystream_pos == keystream_end) {
            /*
             * Generate some keystream.
             */
            for (uint8_t *block = ctx->iv.sdctr.keystream;
                 block < keystream_end; block += 16) {
                /* Format the counter value into the buffer. */
                for (unsigned i = 0; i < SDCTR_WORDS; i++)
                    PUT_BIGNUMINT_MSB_FIRST(
                        block + 16 - BIGNUM_INT_BYTES - i*BIGNUM_INT_BYTES,
                        ctx->iv.sdctr.counter[i]);

                /* Increment the counter. */
                BignumCarry carry = 1;
                for (unsigned i = 0; i < SDCTR_WORDS; i++)
                    BignumADC(ctx->iv.sdctr.counter[i], carry,
                              ctx->iv.sdctr.counter[i], 0, carry);
            }

            /* Encrypt all those counter blocks. */
            aes_sliced_e_parallel(ctx->iv.sdctr.keystream,
                                  ctx->iv.sdctr.keystream, &ctx->sk);

            /* Reset keystream_pos to the start of the buffer. */
            ctx->iv.sdctr.keystream_pos = ctx->iv.sdctr.keystream;
        }

        memxor16(blk, blk, ctx->iv.sdctr.keystream_pos);
        ctx->iv.sdctr.keystream_pos += 16;
    }
}